

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_setopt(CURLM *m,CURLMoption option,...)

{
  CURLMcode CVar1;
  CURLMcode CVar2;
  undefined4 uVar3;
  byte local_a8;
  uint7 uStack_a7;
  va_list param;
  
  if (m == (CURLM *)0x0) {
    return CURLM_BAD_HANDLE;
  }
  if (*m != 0xbab1e) {
    return CURLM_BAD_HANDLE;
  }
  if ((*(byte *)((long)m + 0x271) & 4) != 0) {
    return CURLM_RECURSIVE_API_CALL;
  }
  CVar1 = CURLM_OK;
  if (0x271a < (int)option) {
    if ((int)option < 0x4e24) {
      if (option - CURLMOPT_PIPELINING_SITE_BL < 2) {
        return CURLM_OK;
      }
      if (option == CURLMOPT_PUSHDATA) {
        *(ulong *)((long)m + 0x98) = CONCAT71(uStack_a7,local_a8);
        return CURLM_OK;
      }
      if (option == CURLMOPT_SOCKETFUNCTION) {
        *(ulong *)((long)m + 0x80) = CONCAT71(uStack_a7,local_a8);
        return CURLM_OK;
      }
    }
    else {
      if (option - CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE < 2) {
        return CURLM_OK;
      }
      if (option == CURLMOPT_TIMERFUNCTION) {
        *(ulong *)((long)m + 0x238) = CONCAT71(uStack_a7,local_a8);
        return CURLM_OK;
      }
      if (option == CURLMOPT_PUSHFUNCTION) {
        *(ulong *)((long)m + 0x90) = CONCAT71(uStack_a7,local_a8);
        return CURLM_OK;
      }
    }
    goto switchD_0014afb8_caseD_4;
  }
  CVar2 = CURLM_OK;
  switch(option) {
  case CURLMOPT_PIPELINING:
    *(byte *)((long)m + 0x271) = *(byte *)((long)m + 0x271) & 0xfe | local_a8 >> 1 & 1;
    CVar2 = CVar1;
    break;
  case CURLMOPT_MAXCONNECTS:
    CVar2 = CVar1;
    if (uStack_a7 >> 0x18 == 0) {
      *(int *)((long)m + 0x26c) = (int)CONCAT71(uStack_a7,local_a8);
    }
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    *(ulong *)((long)m + 0x228) = CONCAT71(uStack_a7,local_a8);
    CVar2 = CVar1;
    break;
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    *(ulong *)((long)m + 0x230) = CONCAT71(uStack_a7,local_a8);
    CVar2 = CVar1;
    break;
  case CURLMOPT_MAX_CONCURRENT_STREAMS:
    uVar3 = 100;
    if (0xffffffff80000000 < CONCAT71(uStack_a7,local_a8) - 0x80000000U) {
      uVar3 = (undefined4)CONCAT71(uStack_a7,local_a8);
    }
    *(undefined4 *)((long)m + 0x268) = uVar3;
    CVar2 = CVar1;
    break;
  default:
    if (option == CURLMOPT_SOCKETDATA) {
      *(ulong *)((long)m + 0x88) = CONCAT71(uStack_a7,local_a8);
      return CURLM_OK;
    }
    if (option == CURLMOPT_TIMERDATA) {
      *(ulong *)((long)m + 0x240) = CONCAT71(uStack_a7,local_a8);
      return CURLM_OK;
    }
  case 4:
  case 5:
  case 9:
  case 10:
  case CURLMOPT_MAX_PIPELINE_LENGTH|CURLMOPT_PIPELINING:
  case 0xc:
  case CURLMOPT_MAX_PIPELINE_LENGTH|CURLMOPT_MAXCONNECTS:
  case CURLMOPT_MAX_PIPELINE_LENGTH|CURLMOPT_MAX_HOST_CONNECTIONS:
switchD_0014afb8_caseD_4:
    CVar2 = CURLM_UNKNOWN_OPTION;
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_setopt(CURLM *m,
                            CURLMoption option, ...)
{
  CURLMcode res = CURLM_OK;
  va_list param;
  unsigned long uarg;
  struct Curl_multi *multi = m;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  va_start(param, option);

  switch(option) {
  case CURLMOPT_SOCKETFUNCTION:
    multi->socket_cb = va_arg(param, curl_socket_callback);
    break;
  case CURLMOPT_SOCKETDATA:
    multi->socket_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PUSHFUNCTION:
    multi->push_cb = va_arg(param, curl_push_callback);
    break;
  case CURLMOPT_PUSHDATA:
    multi->push_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PIPELINING:
    multi->multiplexing = va_arg(param, long) & CURLPIPE_MULTIPLEX ? 1 : 0;
    break;
  case CURLMOPT_TIMERFUNCTION:
    multi->timer_cb = va_arg(param, curl_multi_timer_callback);
    break;
  case CURLMOPT_TIMERDATA:
    multi->timer_userp = va_arg(param, void *);
    break;
  case CURLMOPT_MAXCONNECTS:
    uarg = va_arg(param, unsigned long);
    if(uarg <= UINT_MAX)
      multi->maxconnects = (unsigned int)uarg;
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    multi->max_host_connections = va_arg(param, long);
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    multi->max_total_connections = va_arg(param, long);
    break;
    /* options formerly used for pipelining */
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    break;
  case CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_PIPELINING_SITE_BL:
    break;
  case CURLMOPT_PIPELINING_SERVER_BL:
    break;
  case CURLMOPT_MAX_CONCURRENT_STREAMS:
    {
      long streams = va_arg(param, long);
      if((streams < 1) || (streams > INT_MAX))
        streams = 100;
      multi->max_concurrent_streams = (unsigned int)streams;
    }
    break;
  default:
    res = CURLM_UNKNOWN_OPTION;
    break;
  }
  va_end(param);
  return res;
}